

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_acl.c
# Opt level: O2

wchar_t isint(char *start,char *end,wchar_t *result)

{
  byte bVar1;
  wchar_t in_EAX;
  wchar_t wVar2;
  
  if (start < end) {
    in_EAX = L'\0';
    for (; start < end; start = (char *)((byte *)start + 1)) {
      bVar1 = *start;
      if ((byte)(bVar1 - 0x3a) < 0xf6) {
        return in_EAX;
      }
      wVar2 = L'\x7fffffff';
      if ((in_EAX < L'\x0ccccccd') && ((in_EAX != L'\x0ccccccc' || (bVar1 < 0x38)))) {
        wVar2 = in_EAX * 10 + (uint)bVar1 + L'\xffffffd0';
      }
      in_EAX = wVar2;
    }
    *result = in_EAX;
  }
  return in_EAX;
}

Assistant:

static int
isint(const char *start, const char *end, int *result)
{
	int n = 0;
	if (start >= end)
		return (0);
	while (start < end) {
		if (*start < '0' || *start > '9')
			return (0);
		if (n > (INT_MAX / 10) ||
		    (n == INT_MAX / 10 && (*start - '0') > INT_MAX % 10)) {
			n = INT_MAX;
		} else {
			n *= 10;
			n += *start - '0';
		}
		start++;
	}
	*result = n;
	return (1);
}